

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O1

void __thiscall ipx::LpSolver::PrintSummary(LpSolver *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ostream *poVar4;
  Int status;
  Int status_00;
  fmtflags in_R8D;
  double d;
  stringstream h_logging_stream;
  char local_319;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  paVar1 = &local_318.field_2;
  local_318._M_string_length = 0;
  local_318.field_2._M_local_buf[0] = '\0';
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Summary\n",8);
  if ((this->control_).parameters_.super_ipx_parameters.timeless_log == false) {
    Textline<char[9]>(&local_318,(char (*) [9])"Runtime:");
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_318._M_dataplus._M_p,local_318._M_string_length);
    d = Control::Elapsed(&this->control_);
    Format_abi_cxx11_(&local_2f8,(ipx *)0x0,d,2,4,in_R8D);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_2f8._M_dataplus._M_p,local_2f8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"s\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != paVar1) {
      operator_delete(local_318._M_dataplus._M_p);
    }
  }
  Textline<char[29]>(&local_318,(char (*) [29])"Status interior point solve:");
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_318._M_dataplus._M_p,local_318._M_string_length);
  StatusString_abi_cxx11_
            (&local_2f8,(ipx *)(ulong)(uint)(this->info_).super_ipx_info.status_ipm,status);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_2f8._M_dataplus._M_p,local_2f8._M_string_length);
  local_2d8._M_dataplus._M_p._0_1_ = 10;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_2d8,1);
  Textline<char[18]>(&local_2d8,(char (*) [18])"Status crossover:");
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(char *)CONCAT71(local_2d8._M_dataplus._M_p._1_7_,
                                              local_2d8._M_dataplus._M_p._0_1_),
                      local_2d8._M_string_length);
  StatusString_abi_cxx11_
            (&local_2b8,(ipx *)(ulong)(uint)(this->info_).super_ipx_info.status_crossover,status_00)
  ;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
  local_298._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_298,1);
  paVar3 = &local_2b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  paVar2 = &local_2d8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_2d8._M_dataplus._M_p._1_7_,local_2d8._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_2d8._M_dataplus._M_p._1_7_,local_2d8._M_dataplus._M_p._0_1_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p);
  }
  Control::hLog(&this->control_,(stringstream *)local_1b8);
  if ((this->info_).super_ipx_info.status_ipm - 1U < 2) {
    Textline<char[17]>(&local_318,(char (*) [17])"objective value:");
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_318._M_dataplus._M_p,local_318._M_string_length);
    Format_abi_cxx11_(&local_2f8,(ipx *)0x0,(this->info_).super_ipx_info.pobjval,8,0x100,in_R8D);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_2f8._M_dataplus._M_p,local_2f8._M_string_length);
    local_2d8._M_dataplus._M_p._0_1_ = 10;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_2d8,1);
    Textline<char[45]>(&local_2d8,(char (*) [45])"interior solution primal residual (abs/rel):");
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)CONCAT71(local_2d8._M_dataplus._M_p._1_7_,
                                                local_2d8._M_dataplus._M_p._0_1_),
                        local_2d8._M_string_length);
    Format_abi_cxx11_(&local_2b8,(ipx *)0x0,(this->info_).super_ipx_info.abs_presidual,2,0x100,
                      in_R8D);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," / ",3);
    Format_abi_cxx11_(&local_298,(ipx *)0x0,(this->info_).super_ipx_info.rel_presidual,2,0x100,
                      in_R8D);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)CONCAT71(local_298._M_dataplus._M_p._1_7_,
                                                local_298._M_dataplus._M_p._0_1_),
                        local_298._M_string_length);
    local_258._M_dataplus._M_p._0_1_ = 10;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_258,1);
    Textline<char[43]>(&local_258,(char (*) [43])"interior solution dual residual (abs/rel):");
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)CONCAT71(local_258._M_dataplus._M_p._1_7_,
                                                local_258._M_dataplus._M_p._0_1_),
                        local_258._M_string_length);
    Format_abi_cxx11_(&local_1d8,(ipx *)0x0,(this->info_).super_ipx_info.abs_dresidual,2,0x100,
                      in_R8D);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," / ",3);
    Format_abi_cxx11_(&local_1f8,(ipx *)0x0,(this->info_).super_ipx_info.rel_dresidual,2,0x100,
                      in_R8D);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    local_278._M_dataplus._M_p._0_1_ = 10;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_278,1);
    Textline<char[43]>(&local_278,(char (*) [43])"interior solution objective gap (abs/rel):");
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)CONCAT71(local_278._M_dataplus._M_p._1_7_,
                                                local_278._M_dataplus._M_p._0_1_),
                        local_278._M_string_length);
    Format_abi_cxx11_(&local_218,(ipx *)0x0,
                      (this->info_).super_ipx_info.pobjval - (this->info_).super_ipx_info.dobjval,2,
                      0x100,in_R8D);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," / ",3);
    Format_abi_cxx11_(&local_238,(ipx *)0x0,(this->info_).super_ipx_info.rel_objgap,2,0x100,in_R8D);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_238._M_dataplus._M_p,local_238._M_string_length);
    local_319 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_319,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_278._M_dataplus._M_p._1_7_,local_278._M_dataplus._M_p._0_1_) !=
        &local_278.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_278._M_dataplus._M_p._1_7_,local_278._M_dataplus._M_p._0_1_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_258._M_dataplus._M_p._1_7_,local_258._M_dataplus._M_p._0_1_) !=
        &local_258.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_258._M_dataplus._M_p._1_7_,local_258._M_dataplus._M_p._0_1_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_298._M_dataplus._M_p._1_7_,local_298._M_dataplus._M_p._0_1_) !=
        &local_298.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_298._M_dataplus._M_p._1_7_,local_298._M_dataplus._M_p._0_1_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != paVar3) {
      operator_delete(local_2b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_2d8._M_dataplus._M_p._1_7_,local_2d8._M_dataplus._M_p._0_1_) != paVar2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_2d8._M_dataplus._M_p._1_7_,local_2d8._M_dataplus._M_p._0_1_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != paVar1) {
      operator_delete(local_318._M_dataplus._M_p);
    }
    Control::hLog(&this->control_,(stringstream *)local_1b8);
  }
  if ((this->info_).super_ipx_info.status_crossover - 1U < 2) {
    Textline<char[37]>(&local_318,(char (*) [37])"basic solution primal infeasibility:");
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_318._M_dataplus._M_p,local_318._M_string_length);
    Format_abi_cxx11_(&local_2f8,(ipx *)0x0,(this->info_).super_ipx_info.primal_infeas,2,0x100,
                      in_R8D);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_2f8._M_dataplus._M_p,local_2f8._M_string_length);
    local_2d8._M_dataplus._M_p._0_1_ = 10;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_2d8,1);
    Textline<char[35]>(&local_2d8,(char (*) [35])"basic solution dual infeasibility:");
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)CONCAT71(local_2d8._M_dataplus._M_p._1_7_,
                                                local_2d8._M_dataplus._M_p._0_1_),
                        local_2d8._M_string_length);
    Format_abi_cxx11_(&local_2b8,(ipx *)0x0,(this->info_).super_ipx_info.dual_infeas,2,0x100,in_R8D)
    ;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
    local_298._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_298,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != paVar3) {
      operator_delete(local_2b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_2d8._M_dataplus._M_p._1_7_,local_2d8._M_dataplus._M_p._0_1_) != paVar2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_2d8._M_dataplus._M_p._1_7_,local_2d8._M_dataplus._M_p._0_1_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != paVar1) {
      operator_delete(local_318._M_dataplus._M_p);
    }
    Control::hLog(&this->control_,(stringstream *)local_1b8);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void LpSolver::PrintSummary() {
  std::stringstream h_logging_stream;
  h_logging_stream.str(std::string());
  h_logging_stream << "Summary\n";
  if (!control_.timelessLog())
    h_logging_stream << Textline("Runtime:") << fix2(control_.Elapsed()) << "s\n";
  h_logging_stream << Textline("Status interior point solve:")
                   << StatusString(info_.status_ipm) << '\n'
                   << Textline("Status crossover:")
                   << StatusString(info_.status_crossover) << '\n';
  control_.hLog(h_logging_stream);
  if (info_.status_ipm == IPX_STATUS_optimal ||
      info_.status_ipm == IPX_STATUS_imprecise) {
    h_logging_stream
      << Textline("objective value:") << sci8(info_.pobjval) << '\n'
      << Textline("interior solution primal residual (abs/rel):")
      << sci2(info_.abs_presidual) << " / " << sci2(info_.rel_presidual)
      << '\n'
      << Textline("interior solution dual residual (abs/rel):")
      << sci2(info_.abs_dresidual) << " / " << sci2(info_.rel_dresidual)
      << '\n'
      << Textline("interior solution objective gap (abs/rel):")
      << sci2(info_.pobjval-info_.dobjval) << " / "
      << sci2(info_.rel_objgap)  << '\n';
    control_.hLog(h_logging_stream);
  }
  if (info_.status_crossover == IPX_STATUS_optimal ||
      info_.status_crossover == IPX_STATUS_imprecise) {
    h_logging_stream
      << Textline("basic solution primal infeasibility:")
      << sci2(info_.primal_infeas) << '\n'
      << Textline("basic solution dual infeasibility:")
      << sci2(info_.dual_infeas) << '\n';
    control_.hLog(h_logging_stream);
  }
}